

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbasematrix.h
# Opt level: O3

void __thiscall
TPZBlockDiagonal<float>::BuildFromMatrix(TPZBlockDiagonal<float> *this,TPZMatrix<float> *mat)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_XMM0_Da;
  long local_60;
  
  if ((mat->super_TPZBaseMatrix).fRow == (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) {
    lVar1 = (this->fBlockSize).fNElements;
    if (0 < lVar1) {
      lVar3 = 0;
      local_60 = 0;
      do {
        lVar5 = (long)(this->fBlockSize).fStore[lVar3];
        if (0 < lVar5) {
          lVar7 = (this->fBlockPos).fStore[lVar3] << 2;
          lVar2 = 0;
          do {
            lVar4 = local_60;
            lVar6 = lVar5;
            lVar8 = lVar7;
            do {
              (*(mat->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (mat,lVar2 + local_60,lVar4);
              *(undefined4 *)((long)(this->fStorage).fStore + lVar8) = extraout_XMM0_Da;
              lVar8 = lVar8 + lVar5 * 4;
              lVar4 = lVar4 + 1;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            lVar2 = lVar2 + 1;
            lVar7 = lVar7 + 4;
          } while (lVar2 != lVar5);
        }
        local_60 = local_60 + lVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != lVar1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TPZBlockDiagonal::BuildFromMatrix wrong data structure\n",0x37);
  return;
}

Assistant:

inline int64_t Rows() const { return fRow; }